

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

void __thiscall cmake::SetHomeDirectory(cmake *this,string *dir)

{
  cmMessenger *this_00;
  pointer pcVar1;
  bool bVar2;
  ProjectKind PVar3;
  string *psVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  string_view value;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  char local_70;
  string local_68;
  undefined1 local_48 [32];
  char local_28;
  
  cmState::SetSourceDirectory
            ((this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl,dir);
  bVar2 = cmStateSnapshot::IsValid(&this->CurrentSnapshot);
  if (bVar2) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"CMAKE_SOURCE_DIR","");
    value._M_str = (dir->_M_dataplus)._M_p;
    value._M_len = dir->_M_string_length;
    cmStateSnapshot::SetDefinition(&this->CurrentSnapshot,&local_68,value);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  PVar3 = cmState::GetProjectKind
                    ((this->State)._M_t.
                     super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                     super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                     super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
  this_00 = (this->Messenger)._M_t.
            super___uniq_ptr_impl<cmMessenger,_std::default_delete<cmMessenger>_>._M_t.
            super__Tuple_impl<0UL,_cmMessenger_*,_std::default_delete<cmMessenger>_>.
            super__Head_base<0UL,_cmMessenger_*,_false>._M_head_impl;
  if (PVar3 == Normal) {
    psVar4 = cmState::GetSourceDirectory_abi_cxx11_
                       ((this->State)._M_t.
                        super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                        super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                        super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
    paVar5 = &local_80;
    pcVar1 = (psVar4->_M_dataplus)._M_p;
    local_90[0] = paVar5;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_90,pcVar1,pcVar1 + psVar4->_M_string_length);
    local_70 = '\x01';
    cmMessenger::SetTopSource
              (this_00,(optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_90);
    if (local_70 != '\x01') {
      return;
    }
    local_70 = 0;
    local_48._0_8_ = local_90[0];
  }
  else {
    local_28 = '\0';
    cmMessenger::SetTopSource
              (this_00,(optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&((_Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                             *)local_48)->_M_value);
    if (local_28 != '\x01') {
      return;
    }
    paVar5 = &(((_Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                 *)local_48)->_M_value).field_2;
    local_28 = 0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._0_8_ != paVar5) {
    operator_delete((void *)local_48._0_8_,paVar5->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmake::SetHomeDirectory(const std::string& dir)
{
  this->State->SetSourceDirectory(dir);
  if (this->CurrentSnapshot.IsValid()) {
    this->CurrentSnapshot.SetDefinition("CMAKE_SOURCE_DIR", dir);
  }

  if (this->State->GetProjectKind() == cmState::ProjectKind::Normal) {
    this->Messenger->SetTopSource(this->GetHomeDirectory());
  } else {
    this->Messenger->SetTopSource(cm::nullopt);
  }
}